

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

uint __thiscall Compiler::evaluateBracket(Compiler *this,string *originalLine)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  reverse_iterator rVar1;
  bool bVar2;
  long lVar3;
  size_type sVar4;
  reference identifier;
  Scope *pSVar5;
  reference pvVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  string *local_270;
  reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_1f8;
  uint local_1f0;
  byte local_1e9;
  uint c;
  bool isQuoteOpen;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subSegment;
  string peiceBuffer;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a9;
  string *local_1a8;
  string local_1a0 [32];
  string local_180 [32];
  iterator local_160;
  size_type local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  string local_138 [8];
  string arg_1;
  Scope *possibleFunction;
  string *segment;
  undefined1 local_100 [4];
  uint a;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  components;
  string line;
  string *lineToParse;
  reverse_iterator iter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_80 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments;
  anon_class_24_3_01fa67cb handleSubSegment;
  anon_class_8_1_8991fb9c addVariableToStack;
  uint variablesOnStack;
  string *originalLine_local;
  Compiler *this_local;
  
  addVariableToStack.this._4_4_ = 0;
  arguments = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&handleSubSegment.variablesOnStack;
  handleSubSegment.this = (Compiler *)((long)&addVariableToStack.this + 4);
  handleSubSegment.addVariableToStack = (anon_class_8_1_8991fb9c *)this;
  handleSubSegment.variablesOnStack = (uint *)this;
  std::__cxx11::string::string(local_80,(string *)originalLine);
  Parser::extractBracketArguments(&local_60,&this->parser,(string *)local_80);
  std::__cxx11::string::~string(local_80);
  local_48 = &local_60;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&local_60);
  arg = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&local_60);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&arg);
    if (!bVar2) break;
    iter.current._M_current =
         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )__gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end1);
    while( true ) {
      pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)iter.current._M_current);
      if (*pcVar9 != ' ') break;
      std::__cxx11::string::erase((ulong)iter.current._M_current,0);
    }
    std::__cxx11::string::insert((ulong)iter.current._M_current,(char *)0x0);
    while( true ) {
      rVar1.current._M_current = iter.current._M_current;
      std::__cxx11::string::size();
      pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)rVar1.current._M_current);
      rVar1 = iter;
      if (*pcVar9 != ' ') break;
      lVar3 = std::__cxx11::string::size();
      std::__cxx11::string::erase((ulong)rVar1.current._M_current,lVar3 - 1);
    }
    std::__cxx11::string::operator+=((string *)iter.current._M_current,")");
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::rbegin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&stack0xffffffffffffff48);
  while( true ) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::rend((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&lineToParse);
    bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)&stack0xffffffffffffff48,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)&lineToParse);
    if (!bVar2) break;
    addVariableToStack.this._4_4_ = 0;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)&stack0xffffffffffffff48);
    Parser::bracketOperatorFix
              ((Parser *)
               &components.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&this->parser);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_100);
    Parser::extractBracket
              (&this->parser,
               (string *)
               &components.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_100);
    segment._4_4_ = 0;
    while( true ) {
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_100);
      if (sVar4 <= segment._4_4_) break;
      identifier = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_100,(ulong)segment._4_4_);
      pSVar5 = getPastScope(this,identifier);
      if (pSVar5 == (Scope *)0x0) {
        std::__cxx11::string::string
                  ((string *)
                   &subSegment.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&c);
        local_1e9 = 0;
        local_1f0 = 0;
        while( true ) {
          uVar7 = (ulong)local_1f0;
          uVar8 = std::__cxx11::string::size();
          if (uVar8 <= uVar7) break;
          pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)identifier);
          if (*pcVar9 == '\"') {
            local_1e9 = (local_1e9 ^ 0xff) & 1;
          }
          pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)identifier);
          if ((*pcVar9 == ' ') && ((local_1e9 & 1) == 0)) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&c,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &subSegment.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::clear();
          }
          else {
            pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)identifier);
            std::__cxx11::string::operator+=
                      ((string *)
                       &subSegment.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,*pcVar9);
          }
          local_1f0 = local_1f0 + 1;
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&c,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &subSegment.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        evaluateBracket::anon_class_24_3_01fa67cb::operator()
                  ((anon_class_24_3_01fa67cb *)&arguments,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&c);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&c);
        std::__cxx11::string::~string
                  ((string *)
                   &subSegment.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        std::__cxx11::string::string(local_138);
        if (pSVar5->argumentCount != 0) {
          segment._4_4_ = segment._4_4_ + 1;
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_100,(ulong)segment._4_4_);
          std::__cxx11::string::operator=(local_138,(string *)pvVar6);
        }
        local_1a8 = local_1a0;
        std::__cxx11::string::string(local_1a8,(string *)identifier);
        local_1a8 = local_180;
        std::__cxx11::string::string(local_1a8,local_138);
        local_160 = (iterator)local_1a0;
        local_158 = 2;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_1a9);
        __l._M_len = local_158;
        __l._M_array = local_160;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_150,__l,&local_1a9);
        processFunction(this,&local_150,false);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_150);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_1a9);
        local_270 = (string *)&local_160;
        do {
          local_270 = local_270 + -0x20;
          std::__cxx11::string::~string(local_270);
        } while (local_270 != local_1a0);
        addVariableToStack.this._4_4_ = addVariableToStack.this._4_4_ + 1;
        segment._4_4_ = segment._4_4_ + 1;
        std::__cxx11::string::~string(local_138);
      }
      segment._4_4_ = segment._4_4_ + 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_100);
    std::__cxx11::string::~string
              ((string *)
               &components.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&local_1f8,(int)&stack0xffffffffffffff48);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60);
  return 0;
}

Assistant:

unsigned int Compiler::evaluateBracket(std::string originalLine)
{
    unsigned int variablesOnStack = 0;
    variablesOnStack = 0;
    auto addVariableToStack = [&] (const std::string &data) -> void
    {
        if(igen.isVariable(data) != -1) //If it's a variable
        {
            igen.genCloneTop(data);
        }
        else //Else if it's raw data
        {
            if(data[0] == '"') //If string
            {
                igen.genCreateString("", data.substr(1, data.size()-2));
            }
            else if(data[0] == '\'') //If character
            {
                igen.genCreateChar("", data[1]);
            }
            else if(data == "true") //If boolean
            {
                igen.genCreateBool("", true);
            }
            else if(data == "false") //If boolean
            {
                igen.genCreateBool("", false);
            }
            else //Else if number
            {
                igen.genCreateInt("", stoull(data));
            }
        }
    };

    auto handleSubSegment = [&] (const std::vector<std::string> &segments) -> void
    {
        //Get operator of bracket if any
        const std::string &segmentOperator = segments.back();
        //Check to see if it's a variable, if so, float to top of stack
        Instruction segmentInstruction = stringToInstruction(segmentOperator);
        for(unsigned int a = 0; a < segments.size()-1; a++)
        {
            addVariableToStack(segments[a]);
        }
        //If it's an instruction
        if(segmentInstruction != Instruction::NONE)
        {
            if(segments.size() == 1)
            {
                igen.genOperator(segmentInstruction, variablesOnStack);
                variablesOnStack = 0;
            }
            else
            {
                igen.genOperator(segmentInstruction, segments.size() - 1);
            }
            variablesOnStack++;
        }
        else //Else if its a piece of data
        {
            if(segments.size() == 1)
            {
                addVariableToStack(segmentOperator);
                variablesOnStack++;
            }
            variablesOnStack += segments.size()-1;
        }
    };

    //Split the arguments
    std::vector<std::string> &&arguments = parser.extractBracketArguments(originalLine);

    //Bracket all arguments, removing unneeded spaces
    for(auto &arg : arguments)
    {
        while(arg[0] == ' ')
            arg.erase(0, 1);
        arg.insert(0, "(");
        while(arg[arg.size()-1] == ' ')
            arg.erase(arg.size()-1, 1);
        arg += ")";
    }

    //Parse each argument separately
    for(auto iter = arguments.rbegin(); iter != arguments.rend(); iter++)
    {
        variablesOnStack = 0;
        const std::string &lineToParse = *iter;
        std::string line = parser.bracketOperatorFix(lineToParse);
        std::vector<std::string> components;
        parser.extractBracket(line, components);

        //Split segments by space
        for(unsigned int a = 0; a < components.size(); a++)
        {
            const std::string &segment = components[a];

            //If it's a function, call it
            Scope *possibleFunction = getPastScope(segment);
            if(possibleFunction != nullptr) //It's a function
            {
                //Take arguments from next segment only if the function accepts arguments
                std::string arg;
                if(possibleFunction->argumentCount > 0)
                    arg = components[++a];

                //Call it with the provided arguments if any, not destroying the return value
                processFunction({segment, arg}, false);
                variablesOnStack++;
                a++;
            }
            else //It's not a function
            {
                //Split by space
                std::string peiceBuffer;
                std::vector<std::string> subSegment;
                bool isQuoteOpen = false;
                for(unsigned int c = 0; c < segment.size(); c++)
                {
                    if(segment[c] == '"')
                        isQuoteOpen = !isQuoteOpen;
                    if(segment[c] == ' ' && isQuoteOpen == false)
                    {
                        subSegment.emplace_back(peiceBuffer);
                        peiceBuffer.clear();
                    }
                    else
                    {
                        peiceBuffer += segment[c];
                    }
                }
                subSegment.emplace_back(peiceBuffer);
                handleSubSegment(subSegment);
            }
        }
    }
    return 0;
}